

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilCex.c
# Opt level: O0

void Abc_CexPrintStatsInputs(Abc_Cex_t *p,int nRealPis)

{
  int iVar1;
  uint local_24;
  uint local_20;
  int CounterPpi;
  int CounterPi;
  int Counter;
  int k;
  int nRealPis_local;
  Abc_Cex_t *p_local;
  
  CounterPpi = 0;
  local_20 = 0;
  local_24 = 0;
  if (p == (Abc_Cex_t *)0x0) {
    printf("The counter example is NULL.\n");
  }
  else if (p == (Abc_Cex_t *)0x1) {
    printf("The counter example is present but not available (pointer has value \"1\").\n");
  }
  else {
    if (p->nPis < nRealPis) {
      __assert_fail("nRealPis <= p->nPis",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilCex.c"
                    ,0x120,"void Abc_CexPrintStatsInputs(Abc_Cex_t *, int)");
    }
    for (CounterPi = 0; CounterPi < p->nBits; CounterPi = CounterPi + 1) {
      iVar1 = Abc_InfoHasBit((uint *)(p + 1),CounterPi);
      CounterPpi = iVar1 + CounterPpi;
      if (nRealPis != p->nPis) {
        if ((CounterPi - p->nRegs) % p->nPis < nRealPis) {
          iVar1 = Abc_InfoHasBit((uint *)(p + 1),CounterPi);
          local_20 = iVar1 + local_20;
        }
        else {
          iVar1 = Abc_InfoHasBit((uint *)(p + 1),CounterPi);
          local_24 = iVar1 + local_24;
        }
      }
    }
    printf("CEX: Po =%4d  Fr =%4d  FF = %d  PI = %d  Bit =%7d  1 =%8d (%5.2f %%)",
           ((double)CounterPpi * 100.0) / (double)((p->iFrame + 1) * p->nPis),(ulong)(uint)p->iPo,
           (ulong)(uint)p->iFrame,(ulong)(uint)p->nRegs,(ulong)(uint)p->nPis,(ulong)(uint)p->nBits,
           CounterPpi);
    if (nRealPis < p->nPis) {
      printf(" 1pi =%8d (%5.2f %%) 1ppi =%8d (%5.2f %%)",
             ((double)(int)local_20 * 100.0) / (double)((p->iFrame + 1) * nRealPis),
             ((double)(int)local_24 * 100.0) / (double)((p->iFrame + 1) * (p->nPis - nRealPis)),
             (ulong)local_20,(ulong)local_24);
    }
    printf("\n");
  }
  return;
}

Assistant:

void Abc_CexPrintStatsInputs( Abc_Cex_t * p, int nRealPis )
{
    int k, Counter = 0, CounterPi = 0, CounterPpi = 0;
    if ( p == NULL )
    {
        printf( "The counter example is NULL.\n" );
        return;
    }
    if ( p == (Abc_Cex_t *)(ABC_PTRINT_T)1 )
    {
        printf( "The counter example is present but not available (pointer has value \"1\").\n" );
        return;
    }
    assert( nRealPis <= p->nPis );
    for ( k = 0; k < p->nBits; k++ )
    {
        Counter += Abc_InfoHasBit(p->pData, k);
        if ( nRealPis == p->nPis )
            continue;
        if ( (k - p->nRegs) % p->nPis < nRealPis )
            CounterPi += Abc_InfoHasBit(p->pData, k);
        else
            CounterPpi += Abc_InfoHasBit(p->pData, k);
    }
    printf( "CEX: Po =%4d  Fr =%4d  FF = %d  PI = %d  Bit =%7d  1 =%8d (%5.2f %%)", 
        p->iPo, p->iFrame, p->nRegs, p->nPis, p->nBits, 
        Counter,  100.0 * Counter    / ((p->iFrame + 1) * p->nPis ) );
    if ( nRealPis < p->nPis )
    {
        printf( " 1pi =%8d (%5.2f %%) 1ppi =%8d (%5.2f %%)", 
            CounterPi,  100.0 * CounterPi  / ((p->iFrame + 1) * nRealPis ), 
            CounterPpi, 100.0 * CounterPpi / ((p->iFrame + 1) * (p->nPis - nRealPis)) );
    }
    printf( "\n" );
}